

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.cpp
# Opt level: O1

void __thiscall polyscope::WeakReferrable::WeakReferrable(WeakReferrable *this)

{
  int *__p;
  uint64_t uVar1;
  
  this->_vptr_WeakReferrable = (_func_int **)&PTR__WeakReferrable_005f6630;
  __p = (int *)operator_new(4);
  *__p = 0;
  (this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&(this->weakReferrableDummyRef).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  uVar1 = internal::getNextUniqueID();
  this->weakReferableUniqueID = uVar1;
  return;
}

Assistant:

WeakReferrable::WeakReferrable()
    : weakReferrableDummyRef(new WeakHandleDummyType()), weakReferableUniqueID(internal::getNextUniqueID()) {}